

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O1

size_t __thiscall
MMIntern::HttpClient::requestString
          (HttpClient *this,string *url,string *path,string *readBuffer,int timeout,int *http_code)

{
  pointer pcVar1;
  size_type sVar2;
  int *piVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  undefined8 uVar7;
  long *plVar8;
  char *__s;
  size_t sVar9;
  long *plVar10;
  size_t sVar11;
  string query;
  long l_http_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char *local_98;
  long local_90;
  char local_88 [16];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  int *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  *http_code = 0;
  local_98 = local_88;
  pcVar1 = (url->_M_dataplus)._M_p;
  local_58 = http_code;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + url->_M_string_length);
  std::__cxx11::string::_M_append((char *)&local_98,(ulong)(path->_M_dataplus)._M_p);
  readBuffer->_M_string_length = 0;
  *(readBuffer->_M_dataplus)._M_p = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"requesting string from ",0x17);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_98,local_90);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  lVar6 = curl_easy_init();
  if (lVar6 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"curl_easy_init failed, cannot query server ",0x2b);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(url->_M_dataplus)._M_p,url->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," with query ",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_98,local_90);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
    uVar7 = curl_slist_append(0,"Content-Type: text/plain");
    curl_easy_setopt(lVar6,0x2727,uVar7);
    curl_easy_setopt(lVar6,0x2712,local_98);
    curl_easy_setopt(lVar6,0x4e2b,writeStringCallback);
    curl_easy_setopt(lVar6,0x2711,readBuffer);
    curl_easy_setopt(lVar6,99,1);
    curl_easy_setopt(lVar6,0xd,timeout);
    sVar2 = (this->user)._M_string_length;
    if ((sVar2 != 0) && ((this->password)._M_string_length != 0)) {
      pcVar1 = (this->user)._M_dataplus._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar1,pcVar1 + sVar2);
      std::__cxx11::string::append((char *)local_50);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(this->password)._M_dataplus._M_p);
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_68 = *plVar10;
        lStack_60 = plVar8[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar10;
        local_78 = (long *)*plVar8;
      }
      local_70 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      curl_easy_setopt(lVar6,0x2715,local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
    }
    iVar4 = curl_easy_perform(lVar6);
    if (iVar4 == 0) {
      local_78 = (long *)0x0;
      curl_easy_getinfo(lVar6,0x200002);
      piVar3 = local_58;
      curl_easy_cleanup(lVar6);
      *piVar3 = (int)local_78;
      if ((int)local_78 - 200U < 300) {
        sVar11 = readBuffer->_M_string_length;
        goto LAB_00105ce2;
      }
      readBuffer->_M_string_length = 0;
      *(readBuffer->_M_dataplus)._M_p = '\0';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Server ",7);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(url->_M_dataplus)._M_p,url->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with query ",0xc);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_98,local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," replied with code ",0x13);
      plVar8 = (long *)std::ostream::operator<<(poVar5,*piVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"curl_easy_perform() to server ",0x1e);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(url->_M_dataplus)._M_p,url->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with query ",0xc);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_98,local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," failed: ",9);
      __s = (char *)curl_easy_strerror(iVar4);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar9 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  sVar11 = 0;
LAB_00105ce2:
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  return sVar11;
}

Assistant:

std::size_t MMIntern::HttpClient::requestString(const std::string& url, const std::string& path, std::string& readBuffer, int timeout, int& http_code)
{
    http_code = 0;
    std::string query(url);
    query += path;
    
    readBuffer.clear();
    
    std::cout << "requesting string from " << query << std::endl;
    CURL* curl = curl_easy_init();
    if(curl)
    {
        struct curl_slist *headers=nullptr; // init to NULL is important
        headers = curl_slist_append(headers, "Content-Type: text/plain");
        
        curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers );
        curl_easy_setopt(curl, CURLOPT_URL, query.c_str());
        curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, writeStringCallback);
        curl_easy_setopt(curl, CURLOPT_WRITEDATA, &readBuffer);
        curl_easy_setopt(curl, CURLOPT_NOSIGNAL, 1);
        curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
        if (!user.empty() && !password.empty())
        {
            const std::string auth=user+":"+password;
            curl_easy_setopt(curl, CURLOPT_USERPWD, auth.c_str());
        }
        
        CURLcode res = curl_easy_perform(curl);
        if(res != CURLE_OK)
        {
            std::cout << "curl_easy_perform() to server " << url << " with query " << query <<" failed: " << curl_easy_strerror(res) << std::endl;
            return 0;
        }
        long l_http_code = 0;
        curl_easy_getinfo (curl, CURLINFO_RESPONSE_CODE, &l_http_code);
        curl_easy_cleanup(curl);
        http_code = static_cast<int>(l_http_code);
        
        if (!http_server_available(http_code))
        {
            readBuffer.clear();
            std::cout << "Server " << url << " with query " << query <<" replied with code " << http_code << std::endl;
            return 0;
        }
        
        return readBuffer.length();
    }
    else
    {
        std::cout << "curl_easy_init failed, cannot query server " << url << " with query " << query << std::endl;
    }
    
    return 0;
}